

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderTextureFunctionTests.cpp
# Opt level: O2

void deqp::gles3::Functional::evalTexture3DProjOffsetBias(ShaderEvalContext *c,TexLookupParams *p)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  Vector<int,_3> local_5c;
  undefined1 local_50 [32];
  tcu local_30 [8];
  float afStack_28 [2];
  
  fVar1 = c->in[0].m_data[3];
  fVar2 = c->in[0].m_data[0];
  fVar3 = c->in[0].m_data[1];
  fVar4 = c->in[0].m_data[2];
  fVar5 = p->lod;
  fVar6 = c->in[1].m_data[0];
  tcu::Vector<int,_3>::Vector(&local_5c,&p->offset);
  texture3DOffset((ShaderEvalContext *)local_50,fVar2 / fVar1,fVar3 / fVar1,fVar4 / fVar1,
                  fVar5 + fVar6,(IVec3 *)c);
  tcu::operator*((tcu *)(local_50 + 0x10),(Vector<float,_4> *)local_50,&p->scale);
  tcu::operator+(local_30,(Vector<float,_4> *)(local_50 + 0x10),&p->bias);
  *(tcu (*) [8])(c->color).m_data = local_30;
  *(float (*) [2])((c->color).m_data + 2) = afStack_28;
  return;
}

Assistant:

static void		evalTexture3DProjOffsetBias		(gls::ShaderEvalContext& c, const TexLookupParams& p)	{ c.color = texture3DOffset(c, c.in[0].x()/c.in[0].w(), c.in[0].y()/c.in[0].w(), c.in[0].z()/c.in[0].w(), p.lod+c.in[1].x(), p.offset)*p.scale + p.bias; }